

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

double * __thiscall
FlatMap<Point,_double,_PointCmp>::operator[](FlatMap<Point,_double,_PointCmp> *this,Point *key)

{
  bool bVar1;
  pointer ppVar2;
  Point *in_RSI;
  piecewise_construct_t *in_RDI;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  pos;
  Point *in_stack_ffffffffffffff88;
  Point *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffa7;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  local_48;
  pair<Point,_double> *local_40;
  piecewise_construct_t local_31;
  pair<Point,_double> *local_30;
  pair<Point,_double> *local_28;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  local_20;
  Point *local_18;
  double *local_8;
  
  local_18 = in_RSI;
  local_28 = (pair<Point,_double> *)
             std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::
             begin((vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_> *)
                   in_stack_ffffffffffffff88);
  local_30 = (pair<Point,_double> *)
             std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::end
                       ((vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
                         *)in_stack_ffffffffffffff88);
  local_31 = in_RDI[0x19];
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,Point,FlatMap<Point,double,PointCmp>::ValueToKeyComparator>
                       (local_28,local_30,local_18);
  local_40 = (pair<Point,_double> *)
             std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>::end
                       ((vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
                         *)in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
                      *)in_stack_ffffffffffffff90,
                     (__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
                      *)in_stack_ffffffffffffff88);
  uVar3 = true;
  if (!bVar1) {
    in_stack_ffffffffffffff88 = (Point *)(in_RDI + 0x18);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
             ::operator->(&local_20);
    uVar3 = PointCmp::operator()((PointCmp *)in_stack_ffffffffffffff88,local_18,&ppVar2->first);
    in_stack_ffffffffffffff90 = local_18;
  }
  if ((bool)uVar3 == false) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
             ::operator->(&local_20);
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::pair<Point,double>const*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>
    ::__normal_iterator<std::pair<Point,double>*>
              ((__normal_iterator<const_std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
                *)in_stack_ffffffffffffff90,
               (__normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
                *)in_stack_ffffffffffffff88);
    std::forward_as_tuple<Point_const&>(in_stack_ffffffffffffff88);
    local_48._M_current =
         (pair<Point,_double> *)
         std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>::
         emplace<std::piecewise_construct_t_const&,std::tuple<Point_const&>,std::tuple<>>
                   ((vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_> *)
                    CONCAT17(in_stack_ffffffffffffffa7,CONCAT16(uVar3,in_stack_ffffffffffffffa0)),
                    in_stack_ffffffffffffffa8,in_RDI,
                    (tuple<const_Point_&> *)in_stack_ffffffffffffff90,
                    (tuple<> *)in_stack_ffffffffffffff88);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
             ::operator->(&local_48);
  }
  local_8 = &ppVar2->second;
  return local_8;
}

Assistant:

T& operator[](const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(key), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }